

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppRole.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::AppRole::deleteRoleProperty
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,AppRole *this,Path *roleName,Path *propertyName)

{
  Client *client;
  string local_88;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  Url local_48;
  Path *local_28;
  Path *propertyName_local;
  Path *roleName_local;
  AppRole *this_local;
  
  client = *(Client **)this;
  local_28 = propertyName;
  propertyName_local = roleName;
  roleName_local = (Path *)this;
  this_local = (AppRole *)__return_storage_ptr__;
  Vault::operator+(&local_88,roleName,propertyName);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_68,&local_88);
  getUrl(&local_48,this,&local_68);
  HttpConsumer::del(__return_storage_ptr__,client,&local_48);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_48);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::AppRole::deleteRoleProperty(const Path &roleName,
                                   const Path &propertyName) const {
  return HttpConsumer::del(client_, getUrl(Path{roleName + propertyName}));
}